

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_avail_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  longlong lVar1;
  long *in_RCX;
  int in_EDX;
  ImRect *in_RDI;
  longlong in_R8;
  longlong in_R9;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImRect grab_rect;
  ImU32 grab_col;
  ImU32 bg_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  ImS64 scroll_max;
  bool hovered;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  ImS64 win_size_v;
  float scrollbar_size_v;
  ImRect bb;
  bool allow_interaction;
  ImGuiStyle *style;
  float alpha;
  float bb_frame_height;
  float bb_frame_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  ImGuiCol in_stack_ffffffffffffff04;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff08;
  float fVar7;
  undefined4 in_stack_ffffffffffffff14;
  ImGuiButtonFlags in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  ImGuiID in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ImVec2 local_74;
  ImRect local_6c;
  undefined1 local_59;
  ImGuiStyle *local_58;
  float local_4c;
  float local_48;
  float local_44;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  longlong local_30;
  longlong local_28;
  long *local_20;
  int local_18;
  ImRect *local_10;
  
  local_38 = GImGui;
  local_40 = GImGui->CurrentWindow;
  if ((local_40->SkipItems & 1U) == 0) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_10 = in_RDI;
    local_44 = ImRect::GetWidth(in_RDI);
    local_48 = ImRect::GetHeight(local_10);
    if ((0.0 < local_44) && (0.0 < local_48)) {
      local_4c = 1.0;
      if ((local_18 == 1) &&
         (fVar2 = (local_38->Style).FramePadding.y, local_48 < fVar2 + fVar2 + local_38->FontSize))
      {
        local_4c = ImSaturate((local_48 - local_38->FontSize) /
                              ((local_38->Style).FramePadding.y * 2.0));
      }
      if (0.0 < local_4c) {
        local_58 = &local_38->Style;
        local_59 = 1.0 <= local_4c;
        local_6c.Min = local_10->Min;
        local_6c.Max = local_10->Max;
        fVar2 = ImClamp<float>((float)(int)((local_44 - 2.0) * 0.5),0.0,3.0);
        fVar2 = -fVar2;
        fVar3 = ImClamp<float>((float)(int)((local_48 - 2.0) * 0.5),0.0,3.0);
        ImVec2::ImVec2(&local_74,fVar2,-fVar3);
        ImRect::Expand(&local_6c,&local_74);
        if (local_18 == 0) {
          fVar3 = ImRect::GetWidth(&local_6c);
        }
        else {
          fVar3 = ImRect::GetHeight(&local_6c);
        }
        fVar7 = fVar3;
        lVar1 = ImMax<long_long>(local_30,local_28);
        lVar1 = ImMax<long_long>(lVar1,1);
        fVar4 = ImClamp<float>(fVar3 * ((float)local_28 / (float)lVar1),local_58->GrabMinSize,fVar3)
        ;
        ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c,
                       (bool *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (bool *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       in_stack_ffffffffffffff24);
        lVar1 = ImMax<long_long>(1,local_30 - local_28);
        fVar5 = ImSaturate((float)*local_20 / (float)lVar1);
        fVar3 = (fVar5 * (fVar3 - fVar4)) / fVar3;
        GetColorU32(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        uVar6 = 0xf;
        GetColorU32(0xf,in_stack_ffffffffffffff00);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,fVar2),
                   (ImVec2 *)CONCAT44(fVar7,in_stack_ffffffffffffff08),
                   (ImVec2 *)CONCAT44(uVar6,in_stack_ffffffffffffff00),
                   (ImU32)in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                   (ImDrawFlags)in_stack_fffffffffffffef4);
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        if (local_18 == 0) {
          in_stack_ffffffffffffff00 = ImLerp<float>(local_6c.Min.x,local_6c.Max.x,fVar3);
          in_stack_fffffffffffffefc = local_6c.Min.y;
          ImLerp<float>(local_6c.Min.x,local_6c.Max.x,fVar3);
          ImRect::ImRect((ImRect *)CONCAT44(uVar6,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
        }
        else {
          in_stack_fffffffffffffef8 = local_6c.Min.x;
          fVar4 = ImLerp<float>(local_6c.Min.y,local_6c.Max.y,fVar3);
          in_stack_fffffffffffffef4 = local_6c.Max.x;
          ImLerp<float>(local_6c.Min.y,local_6c.Max.y,fVar3);
          ImRect::ImRect((ImRect *)CONCAT44(uVar6,in_stack_ffffffffffffff00),
                         in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef4,fVar4);
        }
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,fVar2),
                   (ImVec2 *)CONCAT44(fVar7,in_stack_ffffffffffffff08),
                   (ImVec2 *)CONCAT44(uVar6,in_stack_ffffffffffffff00),
                   (ImU32)in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                   (ImDrawFlags)in_stack_fffffffffffffef4);
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_avail_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_FLOOR((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_FLOOR((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_avail_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_avail_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_avail_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            seek_absolute = (clicked_v_norm < grab_v_norm || clicked_v_norm > grab_v_norm + grab_h_norm);
            if (seek_absolute)
                g.ScrollbarClickDeltaToGrabCenter = 0.0f;
            else
                g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
        *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}